

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O1

RB90 * __thiscall amrex::FabArrayBase::getRB90(FabArrayBase *this,IntVect *nghost,Box *domain)

{
  _Base_ptr p_Var1;
  bool bVar2;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_> _Var3
  ;
  const_iterator __position;
  RB90 *unaff_RBX;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>_>
  pVar4;
  _Alloc_node __an;
  _Alloc_node local_50;
  pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*> local_48;
  
  pVar4 = std::
          _Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>_>
          ::equal_range((_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>_>
                         *)m_TheRB90Cache,&this->m_bdkey);
  __position._M_node = (_Base_ptr)pVar4.second._M_node;
  _Var3 = pVar4.first._M_node;
  do {
    if (_Var3._M_node == __position._M_node) {
LAB_004a112f:
      if (_Var3._M_node == __position._M_node) {
        unaff_RBX = (RB90 *)operator_new(0x48);
        RB90::RB90(unaff_RBX,this,nghost,domain);
        local_48.first.m_ba_id.data = (this->m_bdkey).m_ba_id.data;
        local_48.first.m_dm_id.data = (this->m_bdkey).m_dm_id.data;
        local_50._M_t =
             (_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>_>
              *)m_TheRB90Cache;
        local_48.second = unaff_RBX;
        std::
        _Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB90*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB90*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB90*>>>
        ::
        _M_insert_equal_<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB90*>,std::_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB90*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB90*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB90*>>>::_Alloc_node>
                  ((_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB90*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB90*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::RB90*>>>
                    *)m_TheRB90Cache,__position,&local_48,&local_50);
      }
      return unaff_RBX;
    }
    p_Var1 = _Var3._M_node[1]._M_left;
    if ((((p_Var1[1]._M_color == nghost->vect[0]) &&
         (*(int *)&p_Var1[1].field_0x4 == nghost->vect[1])) &&
        (*(int *)&p_Var1[1]._M_parent == nghost->vect[2])) &&
       (bVar2 = Box::operator==((Box *)((long)&p_Var1[1]._M_parent + 4),domain), bVar2)) {
      unaff_RBX = (RB90 *)_Var3._M_node[1]._M_left;
      goto LAB_004a112f;
    }
    _Var3._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var3._M_node);
  } while( true );
}

Assistant:

const FabArrayBase::RB90&
FabArrayBase::getRB90 (const IntVect& nghost, const Box& domain) const
{
    BL_PROFILE("FabArrayBase::getRB90()");

    AMREX_ASSERT(getBDKey() == m_bdkey);
    auto er_it = m_TheRB90Cache.equal_range(m_bdkey);
    for (auto it = er_it.first; it != er_it.second; ++it)
    {
        if (it->second->m_ngrow  == nghost &&
            it->second->m_domain == domain)
        {
            return *(it->second);
        }
    }

    RB90* new_rb90 = new RB90(*this, nghost, domain);
    m_TheRB90Cache.insert(er_it.second, RB90Cache::value_type(m_bdkey,new_rb90));

    return *new_rb90;
}